

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismSearcher::HomomorphismSearcher
          (HomomorphismSearcher *this,HomomorphismModel *m,HomomorphismParams *p,
          DuplicateSolutionFilterer *d,shared_ptr<gss::innards::Proof> *f)

{
  uint uVar1;
  HomomorphismModel *pHVar2;
  bool bVar3;
  
  this->model = m;
  this->params = p;
  std::function<bool_(const_gss::innards::HomomorphismAssignments_&)>::function
            (&this->_duplicate_solution_filterer,d);
  std::__shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>,
             &f->super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->global_rand);
  Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>::
  Watches(&this->watches);
  bVar3 = might_have_watches(this->params);
  if (bVar3) {
    pHVar2 = this->model;
    uVar1 = pHVar2->target_size;
    (this->watches).table.target_size = uVar1;
    std::
    vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
    ::resize(&(this->watches).table.data,(ulong)(uVar1 * pHVar2->pattern_size));
  }
  return;
}

Assistant:

HomomorphismSearcher::HomomorphismSearcher(const HomomorphismModel & m, const HomomorphismParams & p,
    const DuplicateSolutionFilterer & d, const std::shared_ptr<Proof> & f) :
    model(m),
    params(p),
    _duplicate_solution_filterer(d),
    proof(f)
{
    if (might_have_watches(params)) {
        watches.table.target_size = model.target_size;
        watches.table.data.resize(model.pattern_size * model.target_size);
    }
}